

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void freeP4(sqlite3 *db,int p4type,void *p4)

{
  Table *pTable;
  sqlite3 *in_RDX;
  int in_ESI;
  long in_RDI;
  SubrtnSig *pSig;
  sqlite3 *in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff0;
  
  pTable = (Table *)(ulong)(in_ESI + 0x11);
  switch(pTable) {
  case (Table *)0x0:
    sqlite3DbFree(in_RDX,pTable);
    sqlite3DbFree(in_RDX,pTable);
    break;
  case (Table *)0x1:
    if (*(long *)(in_RDI + 0x300) == 0) {
      sqlite3DeleteTable(in_stack_ffffffffffffffe0,pTable);
    }
    break;
  case (Table *)0x2:
    freeP4FuncCtx(in_stack_ffffffffffffffe0,(sqlite3_context *)pTable);
    break;
  case (Table *)0x3:
  case (Table *)0x4:
  case (Table *)0x5:
  case (Table *)0xb:
    if (in_RDX != (sqlite3 *)0x0) {
      sqlite3DbNNFreeNN((sqlite3 *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX);
    }
    break;
  case (Table *)0x6:
    if (*(long *)(in_RDI + 0x300) == 0) {
      sqlite3VtabUnlock((VTable *)in_stack_ffffffffffffffe0);
    }
    break;
  case (Table *)0x7:
    if (*(long *)(in_RDI + 0x300) == 0) {
      sqlite3ValueFree((sqlite3_value *)0x16fa28);
    }
    else {
      freeP4Mem(in_stack_ffffffffffffffe0,(Mem *)pTable);
    }
    break;
  case (Table *)0x9:
    if (*(long *)(in_RDI + 0x300) == 0) {
      sqlite3KeyInfoUnref((KeyInfo *)0x16f9f6);
    }
    break;
  case (Table *)0xa:
    freeEphemeralFunction(in_stack_ffffffffffffffe0,(FuncDef *)pTable);
  }
  return;
}

Assistant:

static void freeP4(sqlite3 *db, int p4type, void *p4){
  assert( db );
  switch( p4type ){
    case P4_FUNCCTX: {
      freeP4FuncCtx(db, (sqlite3_context*)p4);
      break;
    }
    case P4_REAL:
    case P4_INT64:
    case P4_DYNAMIC:
    case P4_INTARRAY: {
      if( p4 ) sqlite3DbNNFreeNN(db, p4);
      break;
    }
    case P4_KEYINFO: {
      if( db->pnBytesFreed==0 ) sqlite3KeyInfoUnref((KeyInfo*)p4);
      break;
    }
#ifdef SQLITE_ENABLE_CURSOR_HINTS
    case P4_EXPR: {
      sqlite3ExprDelete(db, (Expr*)p4);
      break;
    }
#endif
    case P4_FUNCDEF: {
      freeEphemeralFunction(db, (FuncDef*)p4);
      break;
    }
    case P4_MEM: {
      if( db->pnBytesFreed==0 ){
        sqlite3ValueFree((sqlite3_value*)p4);
      }else{
        freeP4Mem(db, (Mem*)p4);
      }
      break;
    }
    case P4_VTAB : {
      if( db->pnBytesFreed==0 ) sqlite3VtabUnlock((VTable *)p4);
      break;
    }
    case P4_TABLEREF: {
      if( db->pnBytesFreed==0 ) sqlite3DeleteTable(db, (Table*)p4);
      break;
    }
    case P4_SUBRTNSIG: {
      SubrtnSig *pSig = (SubrtnSig*)p4;
      sqlite3DbFree(db, pSig->zAff);
      sqlite3DbFree(db, pSig);
      break;
    }
  }
}